

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geodesic.cpp
# Opt level: O1

void deleteEmptyEdges(vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *v)

{
  pointer pPVar1;
  bool bVar2;
  long lVar3;
  pointer pPVar4;
  iterator __first;
  
  pPVar4 = (v->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pPVar1 = (v->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar3 = ((long)pPVar1 - (long)pPVar4 >> 3) * -0x71c71c71c71c71c7 >> 2;
  if (0 < lVar3) {
    lVar3 = lVar3 + 1;
    do {
      bVar2 = Bipartition::isEmpty(&pPVar4->super_Bipartition);
      __first._M_current = pPVar4;
      if (bVar2) goto LAB_0011ab9f;
      bVar2 = Bipartition::isEmpty(&pPVar4[1].super_Bipartition);
      __first._M_current = pPVar4 + 1;
      if (bVar2) goto LAB_0011ab9f;
      bVar2 = Bipartition::isEmpty(&pPVar4[2].super_Bipartition);
      __first._M_current = pPVar4 + 2;
      if (bVar2) goto LAB_0011ab9f;
      bVar2 = Bipartition::isEmpty(&pPVar4[3].super_Bipartition);
      __first._M_current = pPVar4 + 3;
      if (bVar2) goto LAB_0011ab9f;
      pPVar4 = pPVar4 + 4;
      lVar3 = lVar3 + -1;
    } while (1 < lVar3);
  }
  lVar3 = ((long)pPVar1 - (long)pPVar4 >> 3) * -0x71c71c71c71c71c7;
  if (lVar3 != 1) {
    if (lVar3 != 2) {
      __first._M_current = pPVar1;
      if ((lVar3 != 3) ||
         (bVar2 = Bipartition::isEmpty(&pPVar4->super_Bipartition), __first._M_current = pPVar4,
         bVar2)) goto LAB_0011ab9f;
      pPVar4 = pPVar4 + 1;
    }
    bVar2 = Bipartition::isEmpty(&pPVar4->super_Bipartition);
    __first._M_current = pPVar4;
    if (bVar2) goto LAB_0011ab9f;
    pPVar4 = pPVar4 + 1;
  }
  bVar2 = Bipartition::isEmpty(&pPVar4->super_Bipartition);
  __first._M_current = pPVar4;
  if (!bVar2) {
    __first._M_current = pPVar1;
  }
LAB_0011ab9f:
  pPVar4 = __first._M_current + 1;
  if (pPVar4 != pPVar1 && __first._M_current != pPVar1) {
    do {
      bVar2 = Bipartition::isEmpty(&pPVar4->super_Bipartition);
      if (!bVar2) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (&((__first._M_current)->super_Bipartition).partition.m_bits,
                   &(pPVar4->super_Bipartition).partition.m_bits);
        ((__first._M_current)->super_Bipartition).partition.m_num_bits =
             (pPVar4->super_Bipartition).partition.m_num_bits;
        (__first._M_current)->length = pPVar4->length;
        ((__first._M_current)->originalEdge).
        super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (pPVar4->originalEdge).super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&((__first._M_current)->originalEdge).
                    super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   &(pPVar4->originalEdge).
                    super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        (__first._M_current)->originalID = pPVar4->originalID;
        __first._M_current = __first._M_current + 1;
      }
      pPVar4 = pPVar4 + 1;
    } while (pPVar4 != pPVar1);
  }
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::_M_erase
            (v,__first,
             (v->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  return;
}

Assistant:

void deleteEmptyEdges(vector<PhyloTreeEdge> &v) {
    v.erase(std::remove_if(v.begin(), v.end(), [](PhyloTreeEdge &element) {
        return element.isEmpty();
    }), v.end());
}